

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_options.h
# Opt level: O2

Options * __thiscall
draco::DracoOptions<draco::GeometryAttribute::Type>::GetAttributeOptions
          (DracoOptions<draco::GeometryAttribute::Type> *this,Type *att_key)

{
  iterator iVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_draco::GeometryAttribute::Type,_draco::Options>_>,_bool>
  pVar2;
  Options new_options;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_88;
  pair<draco::GeometryAttribute::Type,_draco::Options> local_58;
  
  iVar1 = std::
          _Rb_tree<draco::GeometryAttribute::Type,_std::pair<const_draco::GeometryAttribute::Type,_draco::Options>,_std::_Select1st<std::pair<const_draco::GeometryAttribute::Type,_draco::Options>_>,_std::less<draco::GeometryAttribute::Type>,_std::allocator<std::pair<const_draco::GeometryAttribute::Type,_draco::Options>_>_>
          ::find(&(this->attribute_options_)._M_t,att_key);
  if ((_Rb_tree_header *)iVar1._M_node ==
      &(this->attribute_options_)._M_t._M_impl.super__Rb_tree_header) {
    _Stack_88._M_impl.super__Rb_tree_header._M_header._M_left =
         &_Stack_88._M_impl.super__Rb_tree_header._M_header;
    _Stack_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    _Stack_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_88._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Stack_88._M_impl.super__Rb_tree_header._M_header._M_right =
         _Stack_88._M_impl.super__Rb_tree_header._M_header._M_left;
    std::pair<draco::GeometryAttribute::Type,_draco::Options>::pair<draco::Options_&,_true>
              (&local_58,att_key,(Options *)&_Stack_88);
    pVar2 = std::
            _Rb_tree<draco::GeometryAttribute::Type,std::pair<draco::GeometryAttribute::Type_const,draco::Options>,std::_Select1st<std::pair<draco::GeometryAttribute::Type_const,draco::Options>>,std::less<draco::GeometryAttribute::Type>,std::allocator<std::pair<draco::GeometryAttribute::Type_const,draco::Options>>>
            ::_M_emplace_unique<std::pair<draco::GeometryAttribute::Type,draco::Options>>
                      ((_Rb_tree<draco::GeometryAttribute::Type,std::pair<draco::GeometryAttribute::Type_const,draco::Options>,std::_Select1st<std::pair<draco::GeometryAttribute::Type_const,draco::Options>>,std::less<draco::GeometryAttribute::Type>,std::allocator<std::pair<draco::GeometryAttribute::Type_const,draco::Options>>>
                        *)&this->attribute_options_,&local_58);
    iVar1._M_node = (_Base_ptr)pVar2.first._M_node;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_58.second);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&_Stack_88);
  }
  return (Options *)&iVar1._M_node[1]._M_parent;
}

Assistant:

Options *DracoOptions<AttributeKeyT>::GetAttributeOptions(
    const AttributeKeyT &att_key) {
  auto it = attribute_options_.find(att_key);
  if (it != attribute_options_.end()) {
    return &it->second;
  }
  Options new_options;
  it = attribute_options_.insert(std::make_pair(att_key, new_options)).first;
  return &it->second;
}